

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O3

int lzip_tail(archive_read_filter *self)

{
  size_t min;
  void *pvVar1;
  int iVar2;
  long in_RAX;
  int *piVar3;
  char *fmt;
  archive_read *a;
  ssize_t avail_in;
  long local_28;
  
  pvVar1 = self->data;
  min = (ulong)(*(char *)((long)pvVar1 + 0xa2) != '\0') * 8 + 0xc;
  local_28 = in_RAX;
  piVar3 = (int *)__archive_read_filter_ahead(self->upstream,min,&local_28);
  iVar2 = -0x1e;
  if (piVar3 != (int *)0x0 || -1 < local_28) {
    if (local_28 < (long)min || piVar3 == (int *)0x0) {
      a = self->archive;
      fmt = "Lzip: Remaining data is less bytes";
    }
    else if (*(int *)((long)pvVar1 + 0xa4) == *piVar3) {
      if (*(long *)((long)pvVar1 + 0xb0) == *(long *)(piVar3 + 1)) {
        if ((*(char *)((long)pvVar1 + 0xa2) != '\x01') ||
           (*(long *)((long)pvVar1 + 0xa8) + min == *(long *)(piVar3 + 3))) {
          __archive_read_filter_consume(self->upstream,min);
          iVar2 = lzip_has_member(self->upstream);
          if (iVar2 == 0) {
            return 0;
          }
          *(undefined2 *)((long)pvVar1 + 0xa0) = 0;
          *(undefined8 *)((long)pvVar1 + 0xa4) = 0;
          *(undefined8 *)((long)pvVar1 + 0xac) = 0;
          *(undefined4 *)((long)pvVar1 + 0xb4) = 0;
          return 0;
        }
        a = self->archive;
        fmt = "Lzip: Member size error";
      }
      else {
        a = self->archive;
        fmt = "Lzip: Uncompressed size error";
      }
    }
    else {
      a = self->archive;
      fmt = "Lzip: CRC32 error";
    }
    archive_set_error(&a->archive,-1,fmt);
    iVar2 = -0x19;
  }
  return iVar2;
}

Assistant:

static int
lzip_tail(struct archive_read_filter *self)
{
	struct private_data *state;
	const unsigned char *f;
	ssize_t avail_in;
	int tail;

	state = (struct private_data *)self->data;
	if (state->lzip_ver == 0)
		tail = 12;
	else
		tail = 20;
	f = __archive_read_filter_ahead(self->upstream, tail, &avail_in);
	if (f == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	if (f == NULL || avail_in < tail) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Remaining data is less bytes");
		return (ARCHIVE_FAILED);
	}

	/* Check the crc32 value of the uncompressed data of the current
	 * member */
	if (state->crc32 != archive_le32dec(f)) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: CRC32 error");
		return (ARCHIVE_FAILED);
#endif
	}

	/* Check the uncompressed size of the current member */
	if ((uint64_t)state->member_out != archive_le64dec(f + 4)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Uncompressed size error");
		return (ARCHIVE_FAILED);
	}

	/* Check the total size of the current member */
	if (state->lzip_ver == 1 &&
	    (uint64_t)state->member_in + tail != archive_le64dec(f + 12)) {
		archive_set_error(&self->archive->archive, ARCHIVE_ERRNO_MISC,
		    "Lzip: Member size error");
		return (ARCHIVE_FAILED);
	}
	__archive_read_filter_consume(self->upstream, tail);

	/* If current lzip data consists of multi member, try decompressing
	 * a next member. */
	if (lzip_has_member(self->upstream) != 0) {
		state->in_stream = 0;
		state->crc32 = 0;
		state->member_out = 0;
		state->member_in = 0;
		state->eof = 0;
	}
	return (ARCHIVE_OK);
}